

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_db_archive.cpp
# Opt level: O1

void __thiscall
DbArchive_ReadAUint64Span_Test::DbArchive_ReadAUint64Span_Test(DbArchive_ReadAUint64Span_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_DbArchive).super_Test._vptr_Test = (_func_int **)&PTR__DbArchive_00271040;
  in_memory_store::in_memory_store(&(this->super_DbArchive).store_);
  (this->super_DbArchive).super_Test._vptr_Test = (_func_int **)&PTR__DbArchive_00270e58;
  return;
}

Assistant:

TEST_F (DbArchive, ReadAUint64Span) {
    using ::testing::ContainerEq;

    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    std::array<std::uint64_t, 2> const original{{
        UINT64_C (0xF0F0F0F0F0F0F0F0),
        UINT64_C (0xFEEDFACECAFEBEEF),
    }};

    // Append 'original' to the store.
    mock_mutex mutex;
    auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
    pstore::typed_address<std::uint64_t> addr = append_uint64 (transaction, original[0]);
    append_uint64 (transaction, original[1]);

    // Now the read the array back again.
    pstore::serialize::archive::database_reader archive (db, addr.to_address ());
    std::array<std::uint64_t, 2> actual{{UINT64_C (0)}};
    pstore::serialize::read (archive, ::pstore::gsl::span<std::uint64_t>{actual});

    EXPECT_THAT (original, ContainerEq (actual));
}